

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# History.cpp
# Opt level: O0

void __thiscall History::History(History *this)

{
  allocator local_31;
  string local_30;
  History *local_10;
  History *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  History(this,0,0,0,0,0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

History::History() : History(0,0,0,0,0,"") {}